

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O2

bool __thiscall MiddleVal::operator>=(MiddleVal *this,MiddleVal *t)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  bVar2 = std::operator==(&this->Type,"real");
  dVar5 = this->dVal;
  iVar1 = this->iVal;
  bVar3 = std::operator==(&t->Type,"real");
  if (bVar3) {
    dVar4 = t->dVal;
  }
  else {
    dVar4 = (double)t->iVal;
  }
  if (!bVar2) {
    dVar5 = (double)iVar1;
  }
  return dVar4 <= dVar5;
}

Assistant:

bool MiddleVal::operator>=(MiddleVal t) {
    double a,b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    return a>=b;
}